

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbutton.cpp
# Opt level: O2

void __thiscall QToolButton::actionEvent(QToolButton *this,QActionEvent *event)

{
  short sVar1;
  long lVar2;
  QObject *this_00;
  QObject *pQVar3;
  long in_FS_OFFSET;
  Object local_30 [8];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&(this->super_QAbstractButton).super_QWidget.field_0x8;
  this_00 = *(QObject **)(event + 0x10);
  sVar1 = *(short *)(event + 8);
  if (sVar1 == 0x73) {
    if (*(QObject **)(lVar2 + 0x2f0) == this_00) {
      *(undefined8 *)(lVar2 + 0x2f0) = 0;
    }
    if ((*(long *)(lVar2 + 0x2c8) == 0) || (*(int *)(*(long *)(lVar2 + 0x2c8) + 4) == 0)) {
      pQVar3 = (QObject *)0x0;
    }
    else {
      pQVar3 = *(QObject **)(lVar2 + 0x2d0);
    }
    if (pQVar3 == this_00) {
      QWeakPointer<QObject>::assign<QObject>
                ((QWeakPointer<QObject> *)(lVar2 + 0x2c8),(QObject *)0x0);
    }
    QObject::disconnect(this_00,(QObject *)this,(char *)0x0);
  }
  else if (sVar1 == 0x72) {
    QObjectPrivate::connect<void(QAction::*)(bool),void(QToolButtonPrivate::*)()>
              (local_30,(offset_in_QAction_to_subr)this_00,(Object *)QAction::triggered,0,
               (ConnectionType)lVar2);
    QMetaObject::Connection::~Connection((Connection *)local_30);
  }
  else if ((sVar1 == 0x71) && (this_00 == *(QObject **)(lVar2 + 0x2f0))) {
    setDefaultAction(this,(QAction *)this_00);
  }
  QWidget::actionEvent((QWidget *)this,event);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QToolButton::actionEvent(QActionEvent *event)
{
    Q_D(QToolButton);
    auto action = static_cast<QAction *>(event->action());
    switch (event->type()) {
    case QEvent::ActionChanged:
        if (action == d->defaultAction)
            setDefaultAction(action); // update button state
        break;
    case QEvent::ActionAdded:
        QObjectPrivate::connect(action, &QAction::triggered, d,
                                &QToolButtonPrivate::onActionTriggered);
        break;
    case QEvent::ActionRemoved:
        if (d->defaultAction == action)
            d->defaultAction = nullptr;
#if QT_CONFIG(menu)
        if (action == d->menuAction)
            d->menuAction = nullptr;
#endif
        action->disconnect(this);
        break;
    default:
        ;
    }
    QAbstractButton::actionEvent(event);
}